

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_35::InMemoryDirectory::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,InMemoryDirectory *this)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  size_t capacity;
  Type TVar1;
  _Base_ptr p_Var2;
  Array<kj::ReadableDirectory::Entry> *result;
  _Rb_tree_header *p_Var3;
  ArrayBuilder<kj::ReadableDirectory::Entry> builder;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault local_90;
  Entry *local_88;
  Entry *local_80;
  Entry *local_78;
  ArrayDisposer *local_70;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_68;
  Impl *local_60;
  Type local_58;
  String local_50;
  undefined8 local_38;
  undefined8 uStack_30;
  
  this_00 = &this->impl;
  kj::_::Mutex::lock(&this_00->mutex,SHARED);
  local_60 = &(this->impl).value;
  capacity = (this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_68 = this_00;
  local_88 = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                (0x20,0,capacity,(_func_void_void_ptr *)0x0,
                                 (_func_void_void_ptr *)0x0);
  local_78 = local_88 + capacity;
  local_70 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  p_Var2 = *(_Base_ptr *)
            ((long)&(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var3 = &(this->impl).value.entries._M_t._M_impl.super__Rb_tree_header;
  local_80 = local_88;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      TVar1 = *(int *)&p_Var2[2]._M_parent - DIRECTORY;
      if (SYMLINK < TVar1) {
        local_90.exception = (Exception *)0x0;
        local_38 = 0;
        uStack_30 = 0;
        kj::_::Debug::Fault::init
                  (&local_90,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                  );
        kj::_::Debug::Fault::fatal(&local_90);
      }
      local_58 = TVar1;
      heapString(&local_50,*(char **)(p_Var2 + 1),
                 (size_t)((long)&p_Var2[1]._M_parent[-1]._M_right + 7));
      local_80->type = local_58;
      (local_80->name).content.ptr = local_50.content.ptr;
      (local_80->name).content.size_ = local_50.content.size_;
      (local_80->name).content.disposer = local_50.content.disposer;
      local_50.content.ptr = (char *)0x0;
      local_50.content.size_ = 0;
      local_80 = local_80 + 1;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  __return_storage_ptr__->ptr = local_88;
  __return_storage_ptr__->size_ = (long)local_80 - (long)local_88 >> 5;
  __return_storage_ptr__->disposer = local_70;
  kj::_::Mutex::unlock(&this_00->mutex,SHARED);
  return __return_storage_ptr__;
}

Assistant:

Array<Entry> listEntries() const override {
    auto lock = impl.lockShared();
    return KJ_MAP(e, lock->entries) {
      FsNode::Type type;
      if (e.second.node.is<SymlinkNode>()) {
        type = FsNode::Type::SYMLINK;
      } else if (e.second.node.is<FileNode>()) {
        type = FsNode::Type::FILE;
      } else {
        KJ_ASSERT(e.second.node.is<DirectoryNode>());
        type = FsNode::Type::DIRECTORY;
      }

      return Entry { type, heapString(e.first) };
    };
  }